

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkReverseTopoOrder(Abc_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Abc_Obj_t *p_01;
  int i;
  
  if (p->vTopo == (Vec_Int_t *)0x0) {
    p_00 = Vec_IntAlloc(p->vObjs->nSize * 10);
    p->vTopo = p_00;
    Vec_IntFill(p_00,p->vObjs->nSize * 2,0);
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      p_01 = Abc_NtkObj(p,i);
      if ((p_01 != (Abc_Obj_t *)0x0) && ((*(uint *)&p_01->field_0x14 & 0xf) == 7)) {
        iVar1 = Abc_NtkTopoHasBeg(p_01);
        if (iVar1 == 0) {
          Abc_NtkIncrementTravId(p);
          Abc_NtkReverseTopoOrder_rec(p_01,1);
        }
      }
    }
    printf("Nodes = %d.   Size = %d.  Ratio = %f.\n",
           (double)p->vTopo->nSize / (double)p->nObjCounts[7]);
    return;
  }
  __assert_fail("p->vTopo == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0xa50,"void Abc_NtkReverseTopoOrder(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkReverseTopoOrder( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    assert( p->vTopo == NULL );
    p->vTopo = Vec_IntAlloc( 10 * Abc_NtkObjNumMax(p) );
    Vec_IntFill( p->vTopo, 2 * Abc_NtkObjNumMax(p), 0 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        if ( Abc_NtkTopoHasBeg(pObj) )
            continue;
        Abc_NtkIncrementTravId( p );        
        Abc_NtkReverseTopoOrder_rec( pObj, 1 );
    }
    printf( "Nodes = %d.   Size = %d.  Ratio = %f.\n", 
        Abc_NtkNodeNum(p), Vec_IntSize(p->vTopo), 1.0*Vec_IntSize(p->vTopo)/Abc_NtkNodeNum(p) );
}